

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VkDescriptorSet __thiscall
VulkanUtilities::VulkanLogicalDevice::AllocateVkDescriptorSet
          (VulkanLogicalDevice *this,VkDescriptorSetAllocateInfo *AllocInfo,char *DebugName)

{
  VkResult VVar1;
  Char *pCVar2;
  char (*in_RCX) [66];
  VulkanLogicalDevice *pVStack_80;
  VkResult err;
  VkDescriptorSet DescrSet;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  char *DebugName_local;
  VkDescriptorSetAllocateInfo *AllocInfo_local;
  VulkanLogicalDevice *this_local;
  
  msg.field_2._8_8_ = DebugName;
  if (AllocInfo->sType != VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO) {
    Diligent::FormatString<char[26],char[66]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AllocInfo.sType == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO",
               in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [66])0x1a2;
    Diligent::DebugAssertionFailed
              (pCVar2,"AllocateVkDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x1a2);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (AllocInfo->descriptorSetCount != 1) {
    Diligent::FormatString<char[26],char[34]>
              ((string *)&DescrSet,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AllocInfo.descriptorSetCount == 1",(char (*) [34])in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar2,"AllocateVkDescriptorSet",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x1a3);
    std::__cxx11::string::~string((string *)&DescrSet);
  }
  if (msg.field_2._8_8_ == 0) {
    msg.field_2._8_8_ = (long)" \t" + 2;
  }
  pVStack_80 = (VulkanLogicalDevice *)0x0;
  VVar1 = (*vkAllocateDescriptorSets)
                    (this->m_VkDevice,AllocInfo,(VkDescriptorSet *)&stack0xffffffffffffff80);
  if (VVar1 == VK_SUCCESS) {
    if (*(char *)msg.field_2._8_8_ != '\0') {
      SetDescriptorSetName(this->m_VkDevice,(VkDescriptorSet)pVStack_80,(char *)msg.field_2._8_8_);
    }
    this_local = pVStack_80;
  }
  else {
    this_local = (VulkanLogicalDevice *)0x0;
  }
  return (VkDescriptorSet)this_local;
}

Assistant:

VkDescriptorSet VulkanLogicalDevice::AllocateVkDescriptorSet(const VkDescriptorSetAllocateInfo& AllocInfo, const char* DebugName) const
{
    VERIFY_EXPR(AllocInfo.sType == VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO);
    VERIFY_EXPR(AllocInfo.descriptorSetCount == 1);

    if (DebugName == nullptr)
        DebugName = "";

    VkDescriptorSet DescrSet = VK_NULL_HANDLE;

    VkResult err = vkAllocateDescriptorSets(m_VkDevice, &AllocInfo, &DescrSet);
    if (err != VK_SUCCESS)
        return VK_NULL_HANDLE;

    if (*DebugName != 0)
        SetDescriptorSetName(m_VkDevice, DescrSet, DebugName);

    return DescrSet;
}